

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void xmlParsePI(xmlParserCtxtPtr ctxt)

{
  xmlParserInputState xVar1;
  processingInstructionSAXFunc p_Var2;
  xmlType xVar3;
  int iVar4;
  uint val;
  int iVar5;
  xmlCatalogAllow xVar6;
  xmlChar *pxVar7;
  xmlChar *pxVar8;
  xmlChar *pxVar9;
  long lVar10;
  xmlParserInputPtr pxVar11;
  size_t sVar12;
  ulong uVar13;
  int l;
  int local_44;
  xmlChar *local_40;
  int local_34;
  
  if (ctxt->mlType == XML_TYPE_SML) {
    pxVar11 = ctxt->input;
    pxVar7 = pxVar11->cur;
    if (*pxVar7 != '?') {
      return;
    }
    lVar10 = 1;
    iVar4 = 1;
  }
  else {
    if (ctxt->mlType != XML_TYPE_XML) {
      return;
    }
    pxVar11 = ctxt->input;
    pxVar7 = pxVar11->cur;
    if (*pxVar7 != '<') {
      return;
    }
    if (pxVar7[1] != '?') {
      return;
    }
    lVar10 = 2;
    iVar4 = 2;
  }
  iVar5 = pxVar11->id;
  xVar1 = ctxt->instate;
  ctxt->instate = XML_PARSER_PI;
  pxVar11->cur = pxVar7 + lVar10;
  pxVar11->col = pxVar11->col + iVar4;
  if (pxVar7[lVar10] == '\0') {
    xmlParserInputGrow(pxVar11,0xfa);
  }
  if (ctxt->progressive == 0) {
    pxVar11 = ctxt->input;
    if ((500 < (long)pxVar11->cur - (long)pxVar11->base) &&
       ((long)pxVar11->end - (long)pxVar11->cur < 500)) {
      xmlSHRINK(ctxt);
    }
  }
  pxVar7 = xmlParsePITarget(ctxt);
  if (pxVar7 == (xmlChar *)0x0) {
    xmlFatalErr(ctxt,XML_ERR_PI_NOT_STARTED,(char *)0x0);
LAB_0015ff2b:
    if (ctxt->instate == XML_PARSER_EOF) {
      return;
    }
  }
  else {
    xVar3 = ctxt->mlType;
    if (xVar3 == XML_TYPE_SML) {
      pxVar11 = ctxt->input;
      if ((*pxVar11->cur == ';') || (*pxVar11->cur == '\n')) {
LAB_0015fb15:
        if (iVar5 != pxVar11->id) {
          xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                         "PI declaration doesn\'t start and stop in the same entity\n");
          xVar3 = ctxt->mlType;
          pxVar11 = ctxt->input;
        }
        pxVar8 = pxVar11->cur;
        pxVar11->cur = pxVar8 + (ulong)(xVar3 == XML_TYPE_XML) + 1;
        pxVar11->col = (uint)(xVar3 == XML_TYPE_XML) + pxVar11->col + 1;
        if (pxVar8[(ulong)(xVar3 == XML_TYPE_XML) + 1] == '\0') {
          xmlParserInputGrow(pxVar11,0xfa);
        }
        if (((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->disableSAX == 0)) &&
           (p_Var2 = ctxt->sax->processingInstruction, p_Var2 != (processingInstructionSAXFunc)0x0))
        {
          (*p_Var2)(ctxt->userData,pxVar7,(xmlChar *)0x0);
        }
        goto LAB_0015ff2b;
      }
    }
    else if (xVar3 == XML_TYPE_XML) {
      pxVar11 = ctxt->input;
      if ((*pxVar11->cur == '?') && (pxVar11->cur[1] == '>')) goto LAB_0015fb15;
    }
    pxVar8 = (xmlChar *)(*xmlMallocAtomic)(100);
    if (pxVar8 != (xmlChar *)0x0) {
      local_34 = iVar5;
      iVar4 = xmlSkipBlankChars(ctxt);
      if (iVar4 == 0) {
        xmlFatalErrMsgStr(ctxt,XML_ERR_SPACE_REQUIRED,"ParsePI: PI %s space expected\n",pxVar7);
      }
      local_40 = pxVar7;
      val = xmlCurrentChar(ctxt,&local_44);
      sVar12 = 100;
      iVar4 = 0;
      uVar13 = 0;
      while (pxVar7 = local_40, pxVar9 = pxVar8, (int)val < 0x100) {
        if (((int)val < 0x20) && ((0xd < val || ((0x2600U >> (val & 0x1f) & 1) == 0))))
        goto LAB_0015fdef;
LAB_0015fc5d:
        if (ctxt->mlType != XML_TYPE_SML) {
          if ((ctxt->mlType == XML_TYPE_XML) && ((val != 0x3f || (ctxt->input->cur[1] != '>'))))
          goto LAB_0015fc9b;
          goto LAB_0015fdef;
        }
        if ((val == 10) || (val == 0x3b)) goto LAB_0015fdef;
LAB_0015fc9b:
        if (sVar12 <= uVar13 + 5) {
          sVar12 = sVar12 * 2;
          pxVar9 = (xmlChar *)(*xmlRealloc)(pxVar8,sVar12);
          if (pxVar9 == (xmlChar *)0x0) {
            xmlErrMemory(ctxt,(char *)0x0);
            goto LAB_0015ff53;
          }
        }
        if (iVar4 < 0x32) {
          iVar4 = iVar4 + 1;
        }
        else {
          if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa))
          {
            xmlGROW(ctxt);
          }
          if (ctxt->instate == XML_PARSER_EOF) {
            (*xmlFree)(pxVar9);
            return;
          }
          iVar4 = 0;
          if ((10000000 < uVar13) && ((ctxt->options & 0x80000) == 0)) goto LAB_0015fe01;
        }
        if (local_44 == 1) {
          pxVar9[uVar13] = (xmlChar)val;
          uVar13 = uVar13 + 1;
        }
        else {
          iVar5 = xmlCopyCharMultiByte(pxVar9 + uVar13,val);
          uVar13 = uVar13 + (long)iVar5;
        }
        pxVar11 = ctxt->input;
        if (*pxVar11->cur == '\n') {
          pxVar11->line = pxVar11->line + 1;
          pxVar11->col = 1;
        }
        else {
          pxVar11->col = pxVar11->col + 1;
        }
        pxVar11->cur = pxVar11->cur + local_44;
        val = xmlCurrentChar(ctxt,&local_44);
        pxVar8 = pxVar9;
        if (val == 0) {
          if (ctxt->progressive == 0) {
            pxVar11 = ctxt->input;
            if (((((long)pxVar11->cur - (long)pxVar11->base < 0x1f5) ||
                 (499 < (long)pxVar11->end - (long)pxVar11->cur)) ||
                (xmlSHRINK(ctxt), ctxt->progressive == 0)) &&
               ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
              xmlGROW(ctxt);
            }
          }
          val = xmlCurrentChar(ctxt,&local_44);
        }
      }
      if (val - 0x10000 < 0x100000 || (val - 0xe000 < 0x1ffe || val < 0xd800)) goto LAB_0015fc5d;
LAB_0015fdef:
      if ((uVar13 < 0x989681) || ((ctxt->options & 0x80000) != 0)) {
        pxVar8[uVar13] = '\0';
        if ((val == 0x3f || ctxt->mlType != XML_TYPE_XML) &&
           (((ctxt->mlType != XML_TYPE_SML || (val == 10)) || (val == 0x3b)))) {
          pxVar11 = ctxt->input;
          if (local_34 != pxVar11->id) {
            xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                           "PI declaration doesn\'t start and stop in the same entity\n");
            pxVar11 = ctxt->input;
          }
          pxVar9 = pxVar11->cur;
          pxVar11->cur = pxVar9 + 2;
          pxVar11->col = pxVar11->col + 2;
          if (pxVar9[2] == '\0') {
            xmlParserInputGrow(pxVar11,0xfa);
          }
          if ((((uint)xVar1 < 2) &&
              (iVar4 = xmlStrEqual(pxVar7,(xmlChar *)"oasis-xml-catalog"), iVar4 != 0)) &&
             (xVar6 = xmlCatalogGetDefaults(),
             (xVar6 & ~XML_CATA_ALLOW_GLOBAL) == XML_CATA_ALLOW_DOCUMENT)) {
            xmlParseCatalogPI(ctxt,pxVar8);
          }
          if (((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->disableSAX == 0)) &&
             (p_Var2 = ctxt->sax->processingInstruction, p_Var2 != (processingInstructionSAXFunc)0x0
             )) {
            (*p_Var2)(ctxt->userData,pxVar7,pxVar8);
          }
        }
        else {
          xmlFatalErrMsgStr(ctxt,XML_ERR_PI_NOT_FINISHED,"ParsePI: PI %s never end ...\n",local_40);
        }
        (*xmlFree)(pxVar8);
        goto LAB_0015ff2b;
      }
LAB_0015fe01:
      xmlFatalErrMsgStr(ctxt,XML_ERR_PI_NOT_FINISHED,"PI %s too big found",local_40);
      pxVar8 = pxVar9;
LAB_0015ff53:
      (*xmlFree)(pxVar8);
      ctxt->instate = xVar1;
      return;
    }
    xmlErrMemory(ctxt,(char *)0x0);
  }
  ctxt->instate = xVar1;
  return;
}

Assistant:

void
xmlParsePI(xmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    size_t len = 0;
    size_t size = XML_PARSER_BUFFER_SIZE;
    int cur, l;
    const xmlChar *target;
    xmlParserInputState state;
    int count = 0;

    if (CMP2_MLI(CUR_PTR, '<', '?')) {
	int inputid = ctxt->input->id;
	state = ctxt->instate;
        ctxt->instate = XML_PARSER_PI;
	/*
	 * this is a Processing Instruction.
	 */
	SKIP_MLI(2);
	SHRINK;

	/*
	 * Parse the target name and check for special support like
	 * namespace.
	 */
        target = xmlParsePITarget(ctxt);
	if (target != NULL) {
	    if (   (ISXML && (RAW == '?') && (NXT(1) == '>'))
	        || (ISSML && ((RAW == '\n') || (RAW == ';')))) {
		if (inputid != ctxt->input->id) {
		    xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
	                           "PI declaration doesn't start and stop in"
                                   " the same entity\n");
		}
		SKIP_MLI(2);

		/*
		 * SAX: PI detected.
		 */
		if ((ctxt->sax) && (!ctxt->disableSAX) &&
		    (ctxt->sax->processingInstruction != NULL))
		    ctxt->sax->processingInstruction(ctxt->userData,
		                                     target, NULL);
		if (ctxt->instate != XML_PARSER_EOF)
		    ctxt->instate = state;
		return;
	    }
	    buf = (xmlChar *) xmlMallocAtomic(size * sizeof(xmlChar));
	    if (buf == NULL) {
		xmlErrMemory(ctxt, NULL);
		ctxt->instate = state;
		return;
	    }
	    if (SKIP_BLANKS == 0) {
		xmlFatalErrMsgStr(ctxt, XML_ERR_SPACE_REQUIRED,
			  "ParsePI: PI %s space expected\n", target);
	    }
	    cur = CUR_CHAR(l);
	    while (IS_CHAR(cur) && /* checked */
		   (   (ISXML && ((cur != '?') || (NXT(1) != '>')))
		    || (ISSML && (cur != '\n') && (cur != ';')))) {
		if (len + 5 >= size) {
		    xmlChar *tmp;
                    size_t new_size = size * 2;
		    tmp = (xmlChar *) xmlRealloc(buf, new_size);
		    if (tmp == NULL) {
			xmlErrMemory(ctxt, NULL);
			xmlFree(buf);
			ctxt->instate = state;
			return;
		    }
		    buf = tmp;
                    size = new_size;
		}
		count++;
		if (count > 50) {
		    GROW;
                    if (ctxt->instate == XML_PARSER_EOF) {
                        xmlFree(buf);
                        return;
                    }
		    count = 0;
                    if ((len > XML_MAX_TEXT_LENGTH) &&
                        ((ctxt->options & XML_PARSE_HUGE) == 0)) {
                        xmlFatalErrMsgStr(ctxt, XML_ERR_PI_NOT_FINISHED,
                                          "PI %s too big found", target);
                        xmlFree(buf);
                        ctxt->instate = state;
                        return;
                    }
		}
		COPY_BUF(l,buf,len,cur);
		NEXTL(l);
		cur = CUR_CHAR(l);
		if (cur == 0) {
		    SHRINK;
		    GROW;
		    cur = CUR_CHAR(l);
		}
	    }
            if ((len > XML_MAX_TEXT_LENGTH) &&
                ((ctxt->options & XML_PARSE_HUGE) == 0)) {
                xmlFatalErrMsgStr(ctxt, XML_ERR_PI_NOT_FINISHED,
                                  "PI %s too big found", target);
                xmlFree(buf);
                ctxt->instate = state;
                return;
            }
	    buf[len] = 0;
	    if (   (ISXML && (cur != '?'))
	        || (ISSML && (cur != '\n') && (cur != ';'))) {
		xmlFatalErrMsgStr(ctxt, XML_ERR_PI_NOT_FINISHED,
		      "ParsePI: PI %s never end ...\n", target);
	    } else {
		if (inputid != ctxt->input->id) {
		    xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
	                           "PI declaration doesn't start and stop in"
                                   " the same entity\n");
		}
		SKIP(2);

#ifdef LIBXML_CATALOG_ENABLED
		if (((state == XML_PARSER_MISC) ||
	             (state == XML_PARSER_START)) &&
		    (xmlStrEqual(target, XML_CATALOG_PI))) {
		    xmlCatalogAllow allow = xmlCatalogGetDefaults();
		    if ((allow == XML_CATA_ALLOW_DOCUMENT) ||
			(allow == XML_CATA_ALLOW_ALL))
			xmlParseCatalogPI(ctxt, buf);
		}
#endif


		/*
		 * SAX: PI detected.
		 */
		if ((ctxt->sax) && (!ctxt->disableSAX) &&
		    (ctxt->sax->processingInstruction != NULL))
		    ctxt->sax->processingInstruction(ctxt->userData,
		                                     target, buf);
	    }
	    xmlFree(buf);
	} else {
	    xmlFatalErr(ctxt, XML_ERR_PI_NOT_STARTED, NULL);
	}
	if (ctxt->instate != XML_PARSER_EOF)
	    ctxt->instate = state;
    }
}